

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O1

root_type * __thiscall
ising::free_energy::
specific_heat<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>>
          (root_type *__return_storage_ptr__,free_energy *this,
          fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
          *f,fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
             *beta)

{
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> b0;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> f2;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> f1;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> f0;
  multiply_immediates local_319;
  expression<boost::multiprecision::detail::add_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_318;
  uint local_308;
  undefined4 uStack_304;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  undefined4 local_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  undefined4 local_2d8;
  undefined4 uStack_2d4;
  undefined5 uStack_2d0;
  undefined3 uStack_2cb;
  int iStack_2c8;
  byte bStack_2c4;
  undefined8 local_2c0;
  expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_2b8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined4 local_278;
  undefined1 local_274;
  undefined8 local_270;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> local_268;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> local_218;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> local_1c8;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined4 local_138;
  undefined1 local_134;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 local_e8;
  undefined1 local_e4;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined1 local_94;
  undefined8 local_90;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> local_80;
  
  boost::math::differentiation::autodiff_v1::detail::
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  ::derivative<int>(&local_80,
                    (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                     *)this,0);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  ::derivative<int>(&local_1c8,
                    (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                     *)this,1);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  ::derivative<int>(&local_218,
                    (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                     *)this,2);
  boost::math::differentiation::autodiff_v1::detail::
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  ::derivative<int>(&local_268,f,0);
  local_2c0 = 0x1000000000;
  local_308 = 0;
  uStack_304 = 0;
  uStack_300 = 0;
  uStack_2fc = 0;
  local_2f8 = 0;
  uStack_2f4 = 0;
  uStack_2f0 = 0;
  uStack_2ec = 0;
  local_2e8 = 0;
  uStack_2e4 = 0;
  uStack_2e0 = 0;
  uStack_2dc = 0;
  local_2d8 = 0;
  uStack_2d4 = 0;
  uStack_2d0 = 0;
  uStack_2cb = 0;
  iStack_2c8 = 0;
  bStack_2c4 = 0;
  local_2b8.arg1 = &local_268.base;
  local_2b8.arg2 = &local_268.base;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
  ::
  do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
            ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
              *)&local_308,&local_2b8,(multiply_immediates *)&local_d8);
  local_d8 = CONCAT44(uStack_304,local_308);
  uStack_d0 = CONCAT44(uStack_2fc,uStack_300);
  local_c8 = CONCAT44(uStack_2f4,local_2f8);
  uStack_c0 = CONCAT44(uStack_2ec,uStack_2f0);
  local_b8 = CONCAT44(uStack_2e4,local_2e8);
  uStack_b0 = CONCAT44(uStack_2dc,uStack_2e0);
  local_a8 = CONCAT44(uStack_2d4,local_2d8);
  uStack_a0 = CONCAT35(uStack_2cb,uStack_2d0);
  local_98 = iStack_2c8;
  local_94 = bStack_2c4;
  local_90 = local_2c0;
  local_2b8.arg1 = (type)CONCAT44(local_2b8.arg1._4_4_,2);
  local_2b8.arg2 = &local_1c8.base;
  local_2c0 = 0x1000000000;
  local_308 = 0;
  uStack_304 = 0;
  uStack_300 = 0;
  uStack_2fc = 0;
  local_2f8 = 0;
  uStack_2f4 = 0;
  uStack_2f0 = 0;
  uStack_2ec = 0;
  local_2e8 = 0;
  uStack_2e4 = 0;
  uStack_2e0 = 0;
  uStack_2dc = 0;
  local_2d8 = 0;
  uStack_2d4 = 0;
  uStack_2d0 = 0;
  uStack_2cb = 0;
  iStack_2c8 = 0;
  bStack_2c4 = 0;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
  ::
  do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
            ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
              *)&local_308,
             (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
              *)&local_2b8,(multiply_immediates *)&local_128);
  local_128 = CONCAT44(uStack_304,local_308);
  uStack_120 = CONCAT44(uStack_2fc,uStack_300);
  local_118 = CONCAT44(uStack_2f4,local_2f8);
  uStack_110 = CONCAT44(uStack_2ec,uStack_2f0);
  local_108 = CONCAT44(uStack_2e4,local_2e8);
  uStack_100 = CONCAT44(uStack_2dc,uStack_2e0);
  local_f8 = CONCAT44(uStack_2d4,local_2d8);
  uStack_f0 = CONCAT35(uStack_2cb,uStack_2d0);
  local_e8 = iStack_2c8;
  local_e4 = bStack_2c4;
  local_e0 = local_2c0;
  local_2b8.arg1 = &local_268.base;
  local_2b8.arg2 = &local_218.base;
  local_2c0 = 0x1000000000;
  local_308 = 0;
  uStack_304 = 0;
  uStack_300 = 0;
  uStack_2fc = 0;
  local_2f8 = 0;
  uStack_2f4 = 0;
  uStack_2f0 = 0;
  uStack_2ec = 0;
  local_2e8 = 0;
  uStack_2e4 = 0;
  uStack_2e0 = 0;
  uStack_2dc = 0;
  local_2d8 = 0;
  uStack_2d4 = 0;
  uStack_2d0 = 0;
  uStack_2cb = 0;
  iStack_2c8 = 0;
  bStack_2c4 = 0;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
  ::
  do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
            ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
              *)&local_308,&local_2b8,(multiply_immediates *)&local_178);
  local_178 = CONCAT44(uStack_304,local_308);
  uStack_170 = CONCAT44(uStack_2fc,uStack_300);
  local_168 = CONCAT44(uStack_2f4,local_2f8);
  uStack_160 = CONCAT44(uStack_2ec,uStack_2f0);
  local_158 = CONCAT44(uStack_2e4,local_2e8);
  uStack_150 = CONCAT44(uStack_2dc,uStack_2e0);
  local_148 = CONCAT44(uStack_2d4,local_2d8);
  uStack_140 = CONCAT35(uStack_2cb,uStack_2d0);
  local_138 = iStack_2c8;
  local_134 = bStack_2c4;
  local_130 = local_2c0;
  local_2c0 = 0x1000000000;
  local_308 = 0;
  uStack_304 = 0;
  uStack_300 = 0;
  uStack_2fc = 0;
  local_2f8 = 0;
  uStack_2f4 = 0;
  uStack_2f0 = 0;
  uStack_2ec = 0;
  local_2e8 = 0;
  uStack_2e4 = 0;
  uStack_2e0 = 0;
  uStack_2dc = 0;
  local_2d8 = 0;
  uStack_2d4 = 0;
  uStack_2d0 = 0;
  uStack_2cb = 0;
  iStack_2c8 = 0;
  bStack_2c4 = 0;
  local_318.arg1 = (type)&local_128;
  local_318.arg2 = (type)&local_178;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
  ::
  do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::add_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
            ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
              *)&local_308,&local_318,(add_immediates *)&local_2b8);
  local_2b8.arg1 = (type)CONCAT44(uStack_304,local_308);
  local_2b8.arg2 = (type)CONCAT44(uStack_2fc,uStack_300);
  local_2a8 = CONCAT44(uStack_2f4,local_2f8);
  uStack_2a0 = CONCAT44(uStack_2ec,uStack_2f0);
  local_298 = CONCAT44(uStack_2e4,local_2e8);
  uStack_290 = CONCAT44(uStack_2dc,uStack_2e0);
  local_288 = CONCAT44(uStack_2d4,local_2d8);
  uStack_280 = CONCAT35(uStack_2cb,uStack_2d0);
  local_278 = iStack_2c8;
  local_274 = bStack_2c4;
  local_270 = local_2c0;
  local_2c0 = 0x1000000000;
  local_308 = 0;
  uStack_304 = 0;
  uStack_300 = 0;
  uStack_2fc = 0;
  local_2f8 = 0;
  uStack_2f4 = 0;
  uStack_2f0 = 0;
  uStack_2ec = 0;
  local_2e8 = 0;
  uStack_2e4 = 0;
  uStack_2e0 = 0;
  uStack_2dc = 0;
  local_2d8 = 0;
  uStack_2d4 = 0;
  uStack_2d0 = 0;
  uStack_2cb = 0;
  iStack_2c8 = 0;
  bStack_2c4 = 0;
  local_318.arg1 = (type)&local_d8;
  local_318.arg2 = (type)&local_2b8;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
  ::
  do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
            ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
              *)&local_308,
             (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
              *)&local_318,&local_319);
  *(ulong *)((__return_storage_ptr__->base).m_backend.data._M_elems + 0xc) =
       CONCAT44(uStack_2d4,local_2d8);
  *(ulong *)((__return_storage_ptr__->base).m_backend.data._M_elems + 0xe) =
       CONCAT35(uStack_2cb,uStack_2d0);
  *(ulong *)((__return_storage_ptr__->base).m_backend.data._M_elems + 9) =
       CONCAT44(uStack_2e0,uStack_2e4);
  *(ulong *)((__return_storage_ptr__->base).m_backend.data._M_elems + 0xb) =
       CONCAT44(local_2d8,uStack_2dc);
  *(ulong *)((__return_storage_ptr__->base).m_backend.data._M_elems + 5) =
       CONCAT44(uStack_2f0,uStack_2f4);
  *(ulong *)((__return_storage_ptr__->base).m_backend.data._M_elems + 7) =
       CONCAT44(local_2e8,uStack_2ec);
  *(ulong *)((__return_storage_ptr__->base).m_backend.data._M_elems + 1) =
       CONCAT44(uStack_300,uStack_304);
  *(ulong *)((__return_storage_ptr__->base).m_backend.data._M_elems + 3) =
       CONCAT44(local_2f8,uStack_2fc);
  (__return_storage_ptr__->base).m_backend.data._M_elems[0] = local_308;
  (__return_storage_ptr__->base).m_backend.exp = iStack_2c8;
  (__return_storage_ptr__->base).m_backend.neg =
       (bool)((local_308 != 0 || (int)local_2c0 != 0) ^ bStack_2c4);
  (__return_storage_ptr__->base).m_backend.fpclass = (undefined4)local_2c0;
  (__return_storage_ptr__->base).m_backend.prec_elem = local_2c0._4_4_;
  return __return_storage_ptr__;
}

Assistant:

inline typename U::root_type specific_heat(U f, U beta) {
  auto f0 = f.derivative(0);
  auto f1 = f.derivative(1);
  auto f2 = f.derivative(2);
  auto b0 = beta.derivative(0);
  return -(b0 * b0 * (2 * f1 + b0 * f2));
}